

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

map * config_initialize_path(char *path)

{
  _Bool _Var1;
  natwm_error nVar2;
  __uid_t __uid;
  FILE *__stream;
  char *string;
  char *pcVar3;
  map *pmVar4;
  char *pcVar5;
  passwd *ppVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar7;
  char *local_30;
  size_t file_size;
  
  uVar7 = 0x106657;
  if (path == (char *)0x0) {
    pcVar5 = getenv("XDG_CONFIG_HOME");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = getenv("HOME");
      if (pcVar5 == (char *)0x0) {
        __uid = getuid();
        ppVar6 = getpwuid(__uid);
        if (ppVar6 == (passwd *)0x0) goto LAB_001067e0;
        pcVar5 = ppVar6->pw_dir;
      }
      local_30 = string_init(pcVar5);
      string_append(&local_30,"/.config/");
      file_size = (size_t)local_30;
    }
    else {
      file_size = (size_t)string_init(pcVar5);
    }
    if ((char *)file_size == (char *)0x0) {
LAB_001067e0:
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find HOME directory");
      return (map *)0x0;
    }
    string_append((char **)&file_size,"natwm/natwm.config");
    _Var1 = path_exists((char *)file_size);
    if (!_Var1) {
      pcVar5 = "Failed to find configuration file at %s";
LAB_0010682b:
      internal_logger(natwm_logger,LEVEL_ERROR,pcVar5,file_size);
      free((void *)file_size);
      return (map *)0x0;
    }
    __stream = fopen((char *)file_size,"r");
    if (__stream == (FILE *)0x0) {
      pcVar5 = "Failed to open %s";
      goto LAB_0010682b;
    }
    free((void *)file_size);
  }
  else {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find configuration file at %s",path,in_R8,
                      in_R9,uVar7);
      return (map *)0x0;
    }
  }
  local_30 = (char *)0x0;
  nVar2 = get_file_size((FILE *)__stream,(size_t *)&local_30);
  pcVar5 = local_30;
  if ((nVar2 == NO_ERROR) &&
     (string = (char *)malloc((size_t)(local_30 + 1)), string != (char *)0x0)) {
    pcVar3 = (char *)fread(string,1,(size_t)pcVar5,__stream);
    if (pcVar3 == pcVar5) {
      string[(long)pcVar5] = '\0';
      pmVar4 = config_read_string(string,(size_t)local_30);
      free(string);
      if (pmVar4 != (map *)0x0) goto LAB_00106752;
    }
    else {
      free(string);
    }
  }
  pmVar4 = (map *)0x0;
LAB_00106752:
  fclose(__stream);
  return pmVar4;
}

Assistant:

struct map *config_initialize_path(const char *path)
{
        FILE *file = open_config_file(path);

        if (file == NULL) {
                return NULL;
        }

        size_t file_size = 0;

        if (get_file_size(file, &file_size) != NO_ERROR) {
                goto close_file_and_error;
        }

        char *file_buffer = NULL;

        if (read_file_into_buffer(file, &file_buffer, file_size) != 0) {
                goto close_file_and_error;
        }

        struct map *config = config_read_string(file_buffer, file_size);

        if (config == NULL) {
                free(file_buffer);

                goto close_file_and_error;
        }

        free(file_buffer);
        fclose(file);

        return config;

close_file_and_error:
        fclose(file);

        return NULL;
}